

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
BitsToBytes(vector<bool,_std::allocator<bool>_> *bits)

{
  long lVar1;
  const_reference cVar2;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  byte *pbVar4;
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  uint p;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  allocator<unsigned_char> *in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  allocator_type *__n;
  undefined4 local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __n = in_RDI;
  sVar3 = wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(sVar3 + 7 >> 3);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff88);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this,(size_type)__n,in_RDI);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff88);
  for (local_38 = 0;
      sVar3 = wallet::_GLOBAL__N_1::std::vector<bool,_std::allocator<bool>_>::size
                        ((vector<bool,_std::allocator<bool>_> *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)),
      local_38 < sVar3; local_38 = local_38 + 1) {
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff9c = CONCAT13(cVar2,(int3)in_stack_ffffffffffffff9c);
    in_stack_ffffffffffffff98 = (uint)cVar2 << ((byte)local_38 & 7);
    pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        in_stack_ffffffffffffff90);
    *pbVar4 = *pbVar4 | (byte)in_stack_ffffffffffffff98;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_RDI;
}

Assistant:

std::vector<unsigned char> BitsToBytes(const std::vector<bool>& bits)
{
    std::vector<unsigned char> ret((bits.size() + 7) / 8);
    for (unsigned int p = 0; p < bits.size(); p++) {
        ret[p / 8] |= bits[p] << (p % 8);
    }
    return ret;
}